

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O2

int __thiscall http::Page::Printf(Page *this,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vlist;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  char buffer [512];
  
  vlist[0].reg_save_area = local_2c8;
  if (in_AL != '\0') {
    local_298 = in_XMM0_Qa;
    local_288 = in_XMM1_Qa;
    local_278 = in_XMM2_Qa;
    local_268 = in_XMM3_Qa;
    local_258 = in_XMM4_Qa;
    local_248 = in_XMM5_Qa;
    local_238 = in_XMM6_Qa;
    local_228 = in_XMM7_Qa;
  }
  vlist[0].overflow_arg_area = &stack0x00000008;
  vlist[0].gp_offset = 0x10;
  vlist[0].fp_offset = 0x30;
  local_2b8 = in_RDX;
  local_2b0 = in_RCX;
  local_2a8 = in_R8;
  local_2a0 = in_R9;
  vsnprintf(buffer,0x200,format,vlist);
  for (uVar1 = 0; (uVar1 < 0x1ff && (buffer[uVar1] != '\0')); uVar1 = uVar1 + 1) {
    RawSend(this,buffer + uVar1,1);
  }
  return (int)uVar1;
}

Assistant:

int http::Page::Printf(const char* format, ...)
{
    char buffer[BUFFER_SIZE];
    int i;
    va_list vlist;
    int rc;

    va_start(vlist, format);

    vsnprintf(buffer, sizeof(buffer), format, vlist);

    for (i = 0; buffer[i] && i < (int)(sizeof(buffer) - 1); i++)
    {
        RawSend(&buffer[i], 1);
    }
    rc = i;

    return rc;
}